

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::JoinCommonEdges(Clipper *this,bool fixHoleLinkages)

{
  bool bVar1;
  int iVar2;
  JoinRec *pJVar3;
  OutPt *pOVar4;
  iterator __position;
  JoinRec *pJVar5;
  double dVar6;
  IntPoint pt2b;
  IntPoint pt1b;
  IntPoint pt1a;
  IntPoint pt2a;
  OutRec *pOVar7;
  bool bVar8;
  bool bVar9;
  pointer ppJVar10;
  OutPt *pp;
  OutPt *pOVar11;
  OutPt *pOVar12;
  OutPt *p1;
  OutPt *pOVar13;
  OutPt *pOVar14;
  long lVar15;
  OutPt *pOVar16;
  pointer ppOVar17;
  ulong uVar18;
  long lVar19;
  OutPt *p2;
  OutPt *pOVar20;
  ulong uVar21;
  int iVar22;
  undefined7 in_register_00000031;
  OutPt *pp2;
  long64 lVar23;
  OutPt *pOVar24;
  OutPt *pOVar25;
  OutPt *p2_00;
  OutRec *pOVar26;
  IntPoint pt;
  IntPoint pt_00;
  IntPoint pt_01;
  IntPoint pt_02;
  IntPoint pt_03;
  IntPoint pt_04;
  OutRec *outRec2;
  OutPt *pp2a;
  OutPt *pp1a;
  IntPoint pt2;
  IntPoint pt1;
  IntPoint pt3;
  IntPoint pt4;
  OutRec *local_c8;
  OutPt *local_c0;
  OutPt *local_b8;
  undefined4 local_ac;
  OutRec *local_a8;
  OutPt *local_a0;
  OutPt *local_98;
  OutPt *local_90;
  IntPoint local_88;
  IntPoint local_78;
  vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>> *local_60;
  IntPoint local_58;
  IntPoint local_48;
  
  local_ac = (undefined4)CONCAT71(in_register_00000031,fixHoleLinkages);
  ppJVar10 = (this->m_Joins).
             super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Joins).
      super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar10) {
    local_60 = (vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>> *)&this->m_PolyOuts;
    uVar21 = 0;
    do {
      pJVar3 = ppJVar10[uVar21];
      local_a8 = *(OutRec **)(*(long *)local_60 + (long)pJVar3->poly1Idx * 8);
      local_90 = local_a8->pts;
      local_c8 = *(OutRec **)(*(long *)local_60 + (long)pJVar3->poly2Idx * 8);
      local_98 = local_c8->pts;
      local_78.X = (pJVar3->pt2a).X;
      local_78.Y = (pJVar3->pt2a).Y;
      local_88.X = (pJVar3->pt2b).X;
      local_88.Y = (pJVar3->pt2b).Y;
      local_58.X = (pJVar3->pt1a).X;
      local_58.Y = (pJVar3->pt1a).Y;
      local_48.X = (pJVar3->pt1b).X;
      local_48.Y = (pJVar3->pt1b).Y;
      bVar8 = FindSegment(&local_90,&local_78,&local_88);
      pOVar16 = local_90;
      if (bVar8) {
        if (pJVar3->poly1Idx == pJVar3->poly2Idx) {
          local_98 = local_90->next;
          bVar8 = FindSegment(&local_98,&local_58,&local_48);
          if ((bVar8) && (local_98 != pOVar16)) {
LAB_006e1827:
            pt1a.Y = local_78.Y;
            pt1a.X = local_78.X;
            pt1b.Y = local_88.Y;
            pt1b.X = local_88.X;
            pt2a.Y = local_58.Y;
            pt2a.X = local_58.X;
            pt2b.Y = local_48.Y;
            pt2b.X = local_48.X;
            lVar23 = local_58.X;
            bVar8 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_78,&local_88);
            pOVar14 = (OutPt *)local_78.Y;
            pOVar16 = local_90;
            if (bVar8) {
              pOVar4 = local_90->prev;
              pOVar11 = (OutPt *)(local_90->pt).X;
              pOVar20 = (OutPt *)(local_90->pt).Y;
              p2 = (OutPt *)local_78.X;
              pp = local_90;
              if ((pOVar20 != (OutPt *)local_78.Y || pOVar11 != (OutPt *)local_78.X) &&
                 (((OutPt *)(pOVar4->pt).X != (OutPt *)local_78.X ||
                  (pp = pOVar4, (OutPt *)(pOVar4->pt).Y != (OutPt *)local_78.Y)))) {
                local_b8 = (OutPt *)local_78.X;
                pt.Y = lVar23;
                pt.X = local_78.Y;
                pp = InsertPolyPtBetween((ClipperLib *)local_90,pOVar4,(OutPt *)local_78.X,pt);
                pOVar11 = (OutPt *)(pOVar16->pt).X;
                pOVar20 = (OutPt *)(pOVar16->pt).Y;
                p2 = local_b8;
              }
              p2_00 = (OutPt *)local_88.X;
              local_c0 = (OutPt *)local_88.Y;
              pOVar24 = (OutPt *)local_88.Y;
              pOVar12 = pOVar16;
              if ((pOVar20 != (OutPt *)local_88.Y || pOVar11 != (OutPt *)local_88.X) &&
                 (((OutPt *)(pOVar4->pt).X != (OutPt *)local_88.X ||
                  (pOVar12 = pOVar4, (OutPt *)(pOVar4->pt).Y != (OutPt *)local_88.Y)))) {
                local_a0 = pOVar14;
                pOVar14 = pOVar16;
                if (pp == pOVar4 || pp == pOVar16) goto LAB_006e1942;
                pOVar12 = (OutPt *)(pp->pt).X;
                uVar18 = (pp->pt).Y;
                pOVar24 = (OutPt *)(uVar18 ^ local_88.Y | (ulong)pOVar12 ^ local_88.X);
                pOVar13 = pp;
                if (pOVar24 != (OutPt *)0x0) {
                  pOVar14 = pp;
                  if (pOVar11 == pOVar12) {
                    if ((long)pOVar20 < local_88.Y == (long)uVar18 <= local_88.Y) {
LAB_006e1942:
                      pOVar13 = pOVar4;
                      pOVar16 = pOVar14;
                    }
                  }
                  else if ((long)pOVar12 <= local_88.X == (long)pOVar11 < local_88.X)
                  goto LAB_006e1942;
                }
                pt_00.Y = (long64)pOVar24;
                pt_00.X = local_88.Y;
                local_b8 = p2;
                pOVar12 = InsertPolyPtBetween((ClipperLib *)pOVar16,pOVar13,(OutPt *)local_88.X,
                                              pt_00);
                pOVar14 = local_a0;
                p2 = local_b8;
              }
              pOVar20 = local_98;
              pOVar16 = local_98->prev;
              pOVar4 = (OutPt *)(local_98->pt).X;
              pOVar11 = (OutPt *)(local_98->pt).Y;
              pOVar13 = p2;
              p1 = local_98;
              pOVar25 = pOVar14;
              if ((pOVar11 != pOVar14 || pOVar4 != p2) &&
                 (((OutPt *)(pOVar16->pt).X != p2 ||
                  (pOVar13 = pOVar4, p1 = pOVar16, pOVar25 = pOVar11,
                  (OutPt *)(pOVar16->pt).Y != pOVar14)))) {
                local_a0 = p2_00;
                pt_01.Y = (long64)pOVar24;
                pt_01.X = (long64)pOVar14;
                local_b8 = pp;
                p1 = InsertPolyPtBetween((ClipperLib *)local_98,pOVar16,p2,pt_01);
                pOVar13 = (OutPt *)(pOVar20->pt).X;
                pp = local_b8;
                pOVar25 = (OutPt *)(pOVar20->pt).Y;
                p2_00 = local_a0;
              }
              if (((pOVar13 != p2_00) || (pOVar14 = pOVar20, pOVar25 != local_c0)) &&
                 (((OutPt *)(pOVar16->pt).X != p2_00 ||
                  (pOVar14 = pOVar16, (OutPt *)(pOVar16->pt).Y != local_c0)))) {
                if (p1 == pOVar16 || p1 == pOVar20) {
                  pt_02.Y = (long64)pOVar24;
                  pt_02.X = (long64)local_c0;
                  local_b8 = p1;
                  pOVar14 = InsertPolyPtBetween((ClipperLib *)pOVar20,pOVar16,p2_00,pt_02);
                  p1 = local_b8;
                }
                else {
                  pOVar14 = (OutPt *)(p1->pt).X;
                  uVar18 = (p1->pt).Y;
                  pt_03.Y = uVar18 ^ (ulong)local_c0 | (ulong)pOVar14 ^ (ulong)p2_00;
                  local_b8 = pp;
                  if (pt_03.Y != 0) {
                    if (pOVar13 == pOVar14) {
                      if ((long)pOVar25 < (long)local_c0 == (long)uVar18 <= (long)local_c0) {
LAB_006e1af3:
                        pt_04.Y = pt_03.Y;
                        pt_04.X = (long64)local_c0;
                        pOVar14 = InsertPolyPtBetween((ClipperLib *)p1,pOVar16,p2_00,pt_04);
                        pp = local_b8;
                        goto LAB_006e1b14;
                      }
                    }
                    else if ((long)pOVar14 <= (long)p2_00 == (long)pOVar13 < (long)p2_00)
                    goto LAB_006e1af3;
                  }
                  pt_03.X = (long64)local_c0;
                  pOVar14 = InsertPolyPtBetween((ClipperLib *)pOVar20,p1,p2_00,pt_03);
                  pp = local_b8;
                }
              }
LAB_006e1b14:
              pOVar26 = local_a8;
              if ((pp->next == pOVar12) && (p1->prev == pOVar14)) {
                lVar15 = 0x18;
                lVar19 = 0x20;
              }
              else {
                if ((pp->prev != pOVar12) || (p1->next != pOVar14)) goto LAB_006e1b2c;
                lVar15 = 0x20;
                lVar19 = 0x18;
              }
              *(OutPt **)((long)&pp->idx + lVar15) = p1;
              *(OutPt **)((long)&p1->idx + lVar19) = pp;
              *(OutPt **)((long)&pOVar12->idx + lVar19) = pOVar14;
              *(OutPt **)((long)&pOVar14->idx + lVar15) = pOVar12;
              if (pJVar3->poly2Idx == pJVar3->poly1Idx) {
                pOVar16 = GetBottomPt(pp);
                local_a8->pts = pOVar16;
                local_a8->bottomPt = pOVar16;
                pOVar16->idx = local_a8->idx;
                local_c8 = (OutRec *)operator_new(0x38);
                local_c8->isHole = false;
                local_c8->FirstLeft = (OutRec *)0x0;
                local_c8->AppendLink = (OutRec *)0x0;
                local_c8->pts = (OutPt *)0x0;
                local_c8->bottomPt = (OutPt *)0x0;
                *(undefined8 *)((long)&local_c8->bottomPt + 4) = 0;
                *(undefined8 *)((long)&local_c8->bottomFlag + 4) = 0;
                __position._M_current =
                     (this->m_PolyOuts).
                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->m_PolyOuts).
                    super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>::
                  _M_realloc_insert<ClipperLib::OutRec*const&>(local_60,__position,&local_c8);
                  ppOVar17 = (this->m_PolyOuts).
                             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *__position._M_current = local_c8;
                  ppOVar17 = (this->m_PolyOuts).
                             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                  (this->m_PolyOuts).
                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = ppOVar17;
                }
                pOVar7 = local_c8;
                local_c8->idx =
                     (int)((ulong)((long)ppOVar17 -
                                  (long)(this->m_PolyOuts).
                                        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
                iVar22 = local_c8->idx;
                pJVar3->poly2Idx = iVar22;
                pOVar16 = GetBottomPt(pOVar12);
                pOVar26 = local_a8;
                pOVar7->pts = pOVar16;
                pOVar7->bottomPt = pOVar16;
                pOVar16->idx = iVar22;
                bVar8 = PointInPolygon(&local_c8->pts->pt,local_a8->pts,
                                       (bool)(this->_vptr_Clipper[-3] + 0x10)
                                             [(long)&(this->m_PolyOuts).
                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                             ]);
                uVar18 = uVar21;
                if (bVar8) {
                  local_c8->isHole = (bool)(pOVar26->isHole ^ 1);
                  local_c8->FirstLeft = pOVar26;
                  bVar8 = local_c8->isHole;
                  bVar1 = this->m_ReverseOutput;
                  bVar9 = Orientation(local_c8,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                     [(long)&(this->m_PolyOuts).
                                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  pOVar26 = local_a8;
                  if (bVar8 == (bool)(bVar9 ^ bVar1)) {
                    pOVar16 = local_c8->pts;
                    pOVar14 = pOVar16;
                    do {
                      pOVar4 = pOVar14->next;
                      pOVar14->next = pOVar14->prev;
                      pOVar14->prev = pOVar4;
                      pOVar14 = pOVar4;
                    } while (pOVar4 != pOVar16);
                  }
                }
                else {
                  bVar8 = PointInPolygon(&pOVar26->pts->pt,local_c8->pts,
                                         (bool)(this->_vptr_Clipper[-3] + 0x10)
                                               [(long)&(this->m_PolyOuts).
                                                                                                              
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                               ]);
                  local_c8->isHole = pOVar26->isHole;
                  if (bVar8) {
                    pOVar26->isHole = (bool)(local_c8->isHole ^ 1);
                    local_c8->FirstLeft = pOVar26->FirstLeft;
                    pOVar26->FirstLeft = local_c8;
                    bVar8 = pOVar26->isHole;
                    bVar1 = this->m_ReverseOutput;
                    bVar9 = Orientation(local_a8,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                       [(long)&(this->m_PolyOuts).
                                                                                                                              
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                    if (bVar8 == (bool)(bVar9 ^ bVar1)) {
                      pOVar16 = local_a8->pts;
                      pOVar14 = pOVar16;
                      do {
                        pOVar4 = pOVar14->next;
                        pOVar14->next = pOVar14->prev;
                        pOVar14->prev = pOVar4;
                        pOVar14 = pOVar4;
                      } while (pOVar4 != pOVar16);
                    }
                    pOVar26 = local_a8;
                  }
                  else {
                    local_c8->FirstLeft = pOVar26->FirstLeft;
                  }
                  if ((char)local_ac != '\0') {
                    CheckHoleLinkages1(this,pOVar26,local_c8);
                  }
                }
LAB_006e1e39:
                uVar18 = uVar18 + 1;
                ppJVar10 = (this->m_Joins).
                           super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                if (uVar18 < (ulong)((long)(this->m_Joins).
                                           super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppJVar10 >> 3)) {
                  pJVar5 = ppJVar10[uVar18];
                  iVar22 = pJVar3->poly1Idx;
                  if (pJVar5->poly1Idx == pJVar3->poly1Idx) {
                    pOVar16 = pOVar12;
                    do {
                      if (((pOVar16->pt).X == (pJVar5->pt1a).X) &&
                         ((pOVar16->pt).Y == (pJVar5->pt1a).Y)) {
                        pJVar5->poly1Idx = pJVar3->poly2Idx;
                        iVar22 = pJVar3->poly1Idx;
                        break;
                      }
                      pOVar16 = pOVar16->next;
                      iVar22 = pJVar5->poly1Idx;
                    } while (pOVar16 != pOVar12);
                  }
                  if (pJVar5->poly2Idx == iVar22) {
                    pOVar16 = pOVar12;
                    do {
                      if (((pOVar16->pt).X == (pJVar5->pt2a).X) &&
                         ((pOVar16->pt).Y == (pJVar5->pt2a).Y)) {
                        pJVar5->poly2Idx = pJVar3->poly2Idx;
                        break;
                      }
                      pOVar16 = pOVar16->next;
                    } while (pOVar16 != pOVar12);
                  }
                  goto LAB_006e1e39;
                }
                FixupOutPolygon(this,pOVar26);
                FixupOutPolygon(this,local_c8);
                if (pOVar26->pts != (OutPt *)0x0) {
                  bVar8 = Orientation(pOVar26,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                    [(long)&(this->m_PolyOuts).
                                                                                                                        
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  dVar6 = Area(pOVar26,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                             [(long)&(this->m_PolyOuts).
                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                             ]);
                  if (dVar6 <= 0.0 == bVar8) {
                    DisposeBottomPt(this,pOVar26);
                  }
                }
                if (local_c8->pts != (OutPt *)0x0) {
                  bVar8 = Orientation(local_c8,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                     [(long)&(this->m_PolyOuts).
                                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  dVar6 = Area(local_c8,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                              [(long)&(this->m_PolyOuts).
                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                              ]);
                  if (dVar6 <= 0.0 == bVar8) {
                    DisposeBottomPt(this,local_c8);
                  }
                }
              }
              else {
                if ((char)local_ac != '\0') {
                  CheckHoleLinkages2(this,local_a8,local_c8);
                }
                FixupOutPolygon(this,pOVar26);
                if (pOVar26->pts != (OutPt *)0x0) {
                  bVar8 = Orientation(pOVar26,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                    [(long)&(this->m_PolyOuts).
                                                                                                                        
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  pOVar26->isHole = !bVar8;
                  if ((!bVar8) && (pOVar26->FirstLeft == (OutRec *)0x0)) {
                    pOVar26->FirstLeft = local_c8->FirstLeft;
                  }
                }
                iVar22 = pOVar26->idx;
                iVar2 = local_c8->idx;
                local_c8->pts = (OutPt *)0x0;
                local_c8->bottomPt = (OutPt *)0x0;
                local_c8->AppendLink = pOVar26;
                uVar18 = uVar21;
                while( true ) {
                  uVar18 = uVar18 + 1;
                  ppJVar10 = (this->m_Joins).
                             super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->m_Joins).
                                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar10 >> 3
                             ) <= uVar18) break;
                  pJVar3 = ppJVar10[uVar18];
                  if (pJVar3->poly1Idx == iVar2) {
                    pJVar3->poly1Idx = iVar22;
                  }
                  if (pJVar3->poly2Idx == iVar2) {
                    pJVar3->poly2Idx = iVar22;
                  }
                }
              }
            }
          }
        }
        else {
          bVar8 = FindSegment(&local_98,&local_58,&local_48);
          if (bVar8) goto LAB_006e1827;
        }
      }
LAB_006e1b2c:
      uVar21 = uVar21 + 1;
      ppJVar10 = (this->m_Joins).
                 super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->m_Joins).
                                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar10 >> 3
                             ));
  }
  return;
}

Assistant:

void Clipper::JoinCommonEdges(bool fixHoleLinkages)
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
  {
    JoinRec* j = m_Joins[i];
    OutRec *outRec1 = m_PolyOuts[j->poly1Idx];
    OutPt *pp1a = outRec1->pts;
    OutRec *outRec2 = m_PolyOuts[j->poly2Idx];
    OutPt *pp2a = outRec2->pts;
    IntPoint pt1 = j->pt2a, pt2 = j->pt2b;
    IntPoint pt3 = j->pt1a, pt4 = j->pt1b;
    if (!FindSegment(pp1a, pt1, pt2)) continue;
    if (j->poly1Idx == j->poly2Idx)
    {
      //we're searching the same polygon for overlapping segments so
      //segment 2 mustn't be the same as segment 1 ...
      pp2a = pp1a->next;
      if (!FindSegment(pp2a, pt3, pt4) || (pp2a == pp1a)) continue;
    }
    else if (!FindSegment(pp2a, pt3, pt4)) continue;

    if (!GetOverlapSegment(pt1, pt2, pt3, pt4, pt1, pt2)) continue;

    OutPt *p1, *p2, *p3, *p4;
    OutPt *prev = pp1a->prev;
    //get p1 & p2 polypts - the overlap start & endpoints on poly1
    if (PointsEqual(pp1a->pt, pt1)) p1 = pp1a;
    else if (PointsEqual(prev->pt, pt1)) p1 = prev;
    else p1 = InsertPolyPtBetween(pp1a, prev, pt1);

    if (PointsEqual(pp1a->pt, pt2)) p2 = pp1a;
    else if (PointsEqual(prev->pt, pt2)) p2 = prev;
    else if ((p1 == pp1a) || (p1 == prev))
      p2 = InsertPolyPtBetween(pp1a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp1a->pt, p1->pt, pt2))
      p2 = InsertPolyPtBetween(pp1a, p1, pt2); else
      p2 = InsertPolyPtBetween(p1, prev, pt2);

    //get p3 & p4 polypts - the overlap start & endpoints on poly2
    prev = pp2a->prev;
    if (PointsEqual(pp2a->pt, pt1)) p3 = pp2a;
    else if (PointsEqual(prev->pt, pt1)) p3 = prev;
    else p3 = InsertPolyPtBetween(pp2a, prev, pt1);

    if (PointsEqual(pp2a->pt, pt2)) p4 = pp2a;
    else if (PointsEqual(prev->pt, pt2)) p4 = prev;
    else if ((p3 == pp2a) || (p3 == prev))
      p4 = InsertPolyPtBetween(pp2a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp2a->pt, p3->pt, pt2))
      p4 = InsertPolyPtBetween(pp2a, p3, pt2); else
      p4 = InsertPolyPtBetween(p3, prev, pt2);

    //p1.pt == p3.pt and p2.pt == p4.pt so join p1 to p3 and p2 to p4 ...
    if (p1->next == p2 && p3->prev == p4)
    {
      p1->next = p3;
      p3->prev = p1;
      p2->prev = p4;
      p4->next = p2;
    }
    else if (p1->prev == p2 && p3->next == p4)
    {
      p1->prev = p3;
      p3->next = p1;
      p2->next = p4;
      p4->prev = p2;
    }
    else
      continue; //an orientation is probably wrong

    if (j->poly2Idx == j->poly1Idx)
    {
      //instead of joining two polygons, we've just created a new one by
      //splitting one polygon into two.
      outRec1->pts = GetBottomPt(p1);
      outRec1->bottomPt = outRec1->pts;
      outRec1->bottomPt->idx = outRec1->idx;
      outRec2 = CreateOutRec();
      m_PolyOuts.push_back(outRec2);
      outRec2->idx = (int)m_PolyOuts.size()-1;
      j->poly2Idx = outRec2->idx;
      outRec2->pts = GetBottomPt(p2);
      outRec2->bottomPt = outRec2->pts;
      outRec2->bottomPt->idx = outRec2->idx;

      if (PointInPolygon(outRec2->pts->pt, outRec1->pts, m_UseFullRange))
      {
        //outRec2 is contained by outRec1 ...
        outRec2->isHole = !outRec1->isHole;
        outRec2->FirstLeft = outRec1;
        if (outRec2->isHole ==
          (m_ReverseOutput ^ Orientation(outRec2, m_UseFullRange)))
            ReversePolyPtLinks(*outRec2->pts);
      } else if (PointInPolygon(outRec1->pts->pt, outRec2->pts, m_UseFullRange))
      {
        //outRec1 is contained by outRec2 ...
        outRec2->isHole = outRec1->isHole;
        outRec1->isHole = !outRec2->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        outRec1->FirstLeft = outRec2;
        if (outRec1->isHole ==
          (m_ReverseOutput ^ Orientation(outRec1, m_UseFullRange)))
            ReversePolyPtLinks(*outRec1->pts);
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      } else
      {
        outRec2->isHole = outRec1->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      }

      //now fixup any subsequent joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == j->poly1Idx && PointIsVertex(j2->pt1a, p2))
          j2->poly1Idx = j->poly2Idx;
        if (j2->poly2Idx == j->poly1Idx && PointIsVertex(j2->pt2a, p2))
          j2->poly2Idx = j->poly2Idx;
      }

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);
      FixupOutPolygon(*outRec2);

      if (outRec1->pts && (Orientation(outRec1, m_UseFullRange) != (Area(*outRec1, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec1);
      if (outRec2->pts && (Orientation(outRec2, m_UseFullRange) != (Area(*outRec2, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec2);

    } else
    {
      //joined 2 polygons together ...

      //make sure any holes contained by outRec2 now link to outRec1 ...
      if (fixHoleLinkages) CheckHoleLinkages2(outRec1, outRec2);

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);

      if (outRec1->pts)
      {
        outRec1->isHole = !Orientation(outRec1, m_UseFullRange);
        if (outRec1->isHole && !outRec1->FirstLeft)
          outRec1->FirstLeft = outRec2->FirstLeft;
      }

      //delete the obsolete pointer ...
      int OKIdx = outRec1->idx;
      int ObsoleteIdx = outRec2->idx;
      outRec2->pts = 0;
      outRec2->bottomPt = 0;
      outRec2->AppendLink = outRec1;

      //now fixup any subsequent Joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == ObsoleteIdx) j2->poly1Idx = OKIdx;
        if (j2->poly2Idx == ObsoleteIdx) j2->poly2Idx = OKIdx;
      }
    }
  }
}